

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void btreeEnterAll(sqlite3 *db)

{
  Btree *p;
  u8 uVar1;
  long lVar2;
  int i;
  long lVar3;
  
  uVar1 = '\x01';
  lVar2 = 8;
  for (lVar3 = 0; lVar3 < db->nDb; lVar3 = lVar3 + 1) {
    p = *(Btree **)((long)&db->aDb->zDbSName + lVar2);
    if ((p != (Btree *)0x0) && (p->sharable != '\0')) {
      sqlite3BtreeEnter(p);
      uVar1 = '\0';
    }
    lVar2 = lVar2 + 0x20;
  }
  db->noSharedCache = uVar1;
  return;
}

Assistant:

static void SQLITE_NOINLINE btreeEnterAll(sqlite3 *db){
  int i;
  int skipOk = 1;
  Btree *p;
  assert( sqlite3_mutex_held(db->mutex) );
  for(i=0; i<db->nDb; i++){
    p = db->aDb[i].pBt;
    if( p && p->sharable ){
      sqlite3BtreeEnter(p);
      skipOk = 0;
    }
  }
  db->noSharedCache = skipOk;
}